

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  short sVar1;
  sqlite3 *db;
  Table *pTab;
  Column *pCVar2;
  ushort uVar3;
  Column *pCol;
  Expr *pExpr_00;
  Expr x;
  undefined1 local_78 [40];
  anon_union_8_17_dfc45e9e_for_u aStack_50;
  undefined8 local_48;
  AggInfo *pAStack_40;
  anon_union_8_3_c79b3df9_for_y local_38;
  
  db = pParse->db;
  pTab = pParse->pNewTable;
  if (pTab != (Table *)0x0) {
    if ((db->init).busy == '\0') {
      uVar3 = 4;
    }
    else {
      uVar3 = (db->init).iDb == '\x01' ^ 5;
    }
    pCVar2 = pTab->aCol;
    sVar1 = pTab->nCol;
    local_78._36_2_ = uVar3;
    local_78._8_8_ = exprNodeIsConstant;
    local_78._16_8_ = sqlite3SelectWalkFail;
    aStack_50.pNC = aStack_50.pNC & 0xffffffff00000000;
    if (pExpr != (Expr *)0x0) {
      walkExpr((Walker *)local_78,pExpr);
    }
    pCol = pCVar2 + (long)sVar1 + -1;
    if (local_78._36_2_ == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCol->zCnName);
    }
    else if ((pCVar2[(long)sVar1 + -1].colFlags & 0x60) == 0) {
      local_78._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_48._0_2_ = 0;
      local_48._2_2_ = 0;
      local_48._4_4_ = (anon_union_4_2_009eaf8f_for_w)0x0;
      pAStack_40 = (AggInfo *)0x0;
      local_78._32_8_ = (ExprList *)0x0;
      aStack_50.pNC = (NameContext *)0x0;
      local_78._16_8_ = (Expr *)0x0;
      local_78._24_8_ = (Expr *)0x0;
      local_38.pTab = (Table *)0x0;
      local_78._0_8_ = (Parse *)0xb5;
      local_78._8_8_ = sqlite3DbSpanDup(db,zStart,zEnd);
      local_78._4_4_ = 0x2000;
      local_78._16_8_ = pExpr;
      pExpr_00 = exprDup(db,(Expr *)local_78,1,(u8 **)0x0);
      if ((_func_int_Walker_ptr_Expr_ptr *)local_78._8_8_ != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
        sqlite3DbFreeNN(db,(void *)local_78._8_8_);
      }
      sqlite3ColumnSetExpr(pParse,pTab,pCol,pExpr_00);
    }
    else {
      sqlite3ErrorMsg(pParse,"cannot use DEFAULT on a generated column");
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  if (pExpr != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of defaut value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    int isInit = db->init.busy && db->init.iDb!=1;
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, isInit) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zCnName);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( pCol->colFlags & COLFLAG_GENERATED ){
      testcase( pCol->colFlags & COLFLAG_VIRTUAL );
      testcase( pCol->colFlags & COLFLAG_STORED );
      sqlite3ErrorMsg(pParse, "cannot use DEFAULT on a generated column");
#endif
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x, *pDfltExpr;
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pDfltExpr = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
      sqlite3ColumnSetExpr(pParse, p, pCol, pDfltExpr);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}